

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

uint16_t nni_url_default_port(char *scheme)

{
  char cVar1;
  char *__s;
  int iVar2;
  size_t sVar3;
  size_t __n;
  size_t l;
  int i;
  char *s;
  char *scheme_local;
  
  l._4_4_ = 0;
  do {
    __s = nni_url_default_ports[l._4_4_].scheme;
    if (__s == (char *)0x0) {
      return 0;
    }
    sVar3 = strlen(__s);
    __n = strlen(__s);
    iVar2 = strncmp(__s,scheme,__n);
    if (iVar2 == 0) {
      cVar1 = scheme[sVar3];
      if (cVar1 == '\0') {
        return nni_url_default_ports[l._4_4_].port;
      }
      if (((cVar1 == '4') || (cVar1 == '6')) && (scheme[sVar3 + 1] == '\0')) {
        return nni_url_default_ports[l._4_4_].port;
      }
    }
    l._4_4_ = l._4_4_ + 1;
  } while( true );
}

Assistant:

uint16_t
nni_url_default_port(const char *scheme)
{
	const char *s;

	for (int i = 0; (s = nni_url_default_ports[i].scheme) != NULL; i++) {
		size_t l = strlen(s);
		if (strncmp(s, scheme, strlen(s)) != 0) {
			continue;
		}
		// It can have a suffix of either "4" or "6" to restrict
		// the address family.  This is an NNG extension.
		switch (scheme[l]) {
		case '\0':
			return (nni_url_default_ports[i].port);
		case '4':
		case '6':
			if (scheme[l + 1] == '\0') {
				return (nni_url_default_ports[i].port);
			}
			break;
		}
	}
	return (0);
}